

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yprp_enum(lys_ypr_ctx_conflict *pctx,lysp_type_enum *items,LY_DATA_TYPE type,int8_t *flag)

{
  uint16_t *puVar1;
  uint uVar2;
  lysp_ext_instance *plVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  lysp_ext_instance *plVar7;
  ulong uVar8;
  char *format;
  char *in_R8;
  lysp_ext_instance *ext;
  uint64_t u;
  lysp_ext_instance *plVar9;
  int8_t inner_flag;
  char *str;
  undefined1 local_55 [29];
  ulong local_38;
  
  local_55._13_8_ = "enum";
  if (type == LY_TYPE_BITS) {
    local_55._13_8_ = "bit";
  }
  uVar8 = 0;
  local_55._1_4_ = type;
  local_55._21_8_ = items;
  while( true ) {
    if (items == (lysp_type_enum *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ulong *)&items[-1].flags;
    }
    if (uVar6 <= uVar8) break;
    uVar2 = (pctx->field_0).field_0.options;
    if (local_55._1_4_ == LY_TYPE_BITS) {
      uVar6 = 0;
      if ((uVar2 & 2) == 0) {
        uVar6 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      format = "%*s<bit name=\"";
    }
    else {
      uVar6 = 0;
      if ((uVar2 & 2) == 0) {
        uVar6 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      format = "%*s<enum name=\"";
    }
    ly_print_((pctx->field_0).field_0.out,format,uVar6,"");
    local_38 = uVar8;
    lyxml_dump_text((pctx->field_0).field_0.out,items[uVar8].name,'\x01');
    ly_print_((pctx->field_0).field_0.out,"\"");
    local_55[0] = '\0';
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    plVar3 = items[uVar8].exts;
    plVar9 = (lysp_ext_instance *)0x0;
    ext = plVar3;
    while( true ) {
      if (plVar3 == (lysp_ext_instance *)0x0) {
        plVar7 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar7 = plVar3[-1].exts;
      }
      if (plVar7 <= plVar9) break;
      in_R8 = (char *)local_55;
      yprp_extension_instance(pctx,LY_STMT_ENUM,'\0',ext,(int8_t *)local_55);
      plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
      ext = ext + 1;
    }
    yprp_iffeatures(pctx,items[uVar8].iffeatures,items[uVar8].exts,(int8_t *)local_55);
    uVar4 = local_55._21_8_;
    if ((items[uVar8].flags & 0x200) != 0) {
      if (local_55._1_4_ == LY_TYPE_BITS) {
        if (local_55[0] == '\0') {
          local_55[0] = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        ypr_unsigned(pctx,LY_STMT_POSITION,(uint8_t)items[uVar8].exts,(void *)items[uVar8].value,
                     (unsigned_long)in_R8);
      }
      else {
        if (local_55[0] == '\0') {
          local_55[0] = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        in_R8 = (char *)items[uVar8].exts;
        iVar5 = asprintf((char **)(local_55 + 5),"%ld",items[uVar8].value);
        if (iVar5 == -1) {
          in_R8 = "ypr_signed";
          ly_log(((pctx->field_0).field_0.module)->ctx,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).");
        }
        else {
          ypr_substmt(pctx,LY_STMT_VALUE,'\0',(char *)local_55._5_8_,in_R8);
          free((void *)local_55._5_8_);
        }
      }
    }
    ypr_status(pctx,items[uVar8].flags,items[uVar8].exts,(int8_t *)local_55);
    ypr_description(pctx,items[uVar8].dsc,items[uVar8].exts,(int8_t *)local_55);
    ypr_reference(pctx,items[uVar8].ref,items[uVar8].exts,(int8_t *)local_55);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,(char *)local_55._13_8_,local_55[0]);
    uVar8 = local_38 + 1;
    items = (lysp_type_enum *)uVar4;
  }
  return;
}

Assistant:

static void
yprp_enum(struct lys_ypr_ctx *pctx, const struct lysp_type_enum *items, LY_DATA_TYPE type, int8_t *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    int8_t inner_flag;

    (void)flag;

    LY_ARRAY_FOR(items, u) {
        if (type == LY_TYPE_BITS) {
            ly_print_(pctx->out, "%*s<bit name=\"", INDENT);
            lyxml_dump_text(pctx->out, items[u].name, 1);
            ly_print_(pctx->out, "\"");
        } else { /* LY_TYPE_ENUM */
            ly_print_(pctx->out, "%*s<enum name=\"", INDENT);
            lyxml_dump_text(pctx->out, items[u].name, 1);
            ly_print_(pctx->out, "\"");
        }
        inner_flag = 0;
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_ENUM, 0, items[u].exts, &inner_flag);
        yprp_iffeatures(pctx, items[u].iffeatures, items[u].exts, &inner_flag);
        if (items[u].flags & LYS_SET_VALUE) {
            if (type == LY_TYPE_BITS) {
                ypr_close_parent(pctx, &inner_flag);
                ypr_unsigned(pctx, LY_STMT_POSITION, 0, items[u].exts, items[u].value);
            } else { /* LY_TYPE_ENUM */
                ypr_close_parent(pctx, &inner_flag);
                ypr_signed(pctx, LY_STMT_VALUE, 0, items[u].exts, items[u].value);
            }
        }
        ypr_status(pctx, items[u].flags, items[u].exts, &inner_flag);
        ypr_description(pctx, items[u].dsc, items[u].exts, &inner_flag);
        ypr_reference(pctx, items[u].ref, items[u].exts, &inner_flag);
        LEVEL--;
        ypr_close(pctx, type == LY_TYPE_BITS ? "bit" : "enum", inner_flag);
    }
}